

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O2

void Abc_ObjFaninFlipPhase(Abc_Obj_t *p,int i)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  char *__assertion;
  
  pVVar2 = p->pNtk->vPhases;
  if (pVVar2 == (Vec_Int_t *)0x0) {
    __assertion = "p->pNtk->vPhases";
  }
  else {
    if ((-1 < i) && (i < (p->vFanins).nSize)) {
      iVar1 = p->Id;
      if ((-1 < (long)iVar1) && (iVar1 < pVVar2->nSize)) {
        pVVar2->pArray[iVar1] = pVVar2->pArray[iVar1] ^ 1 << ((byte)i & 0x1f);
        return;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    __assertion = "i >= 0 && i < Abc_ObjFaninNum(p)";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,0x18b,"void Abc_ObjFaninFlipPhase(Abc_Obj_t *, int)");
}

Assistant:

static inline void        Abc_ObjFaninFlipPhase( Abc_Obj_t * p,int i){ assert(p->pNtk->vPhases); assert( i >= 0 && i < Abc_ObjFaninNum(p) ); *Vec_IntEntryP(p->pNtk->vPhases, Abc_ObjId(p)) ^= (1 << i);      }